

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint32 **in_n_frame;
  int iVar1;
  uint32 uVar2;
  segdmp_type_t sVar3;
  uint32 i_n_stream;
  cmd_ln_t *pcVar4;
  char *pcVar5;
  long lVar6;
  FILE *pFVar7;
  uint32 *puVar8;
  char **dirs;
  char *pcVar9;
  ulong uVar10;
  uint32 *puVar11;
  uint uVar12;
  segdmp_type_t *in_R9;
  ulong uVar13;
  uint32 *n_seg;
  feat_t *feat;
  model_def_t *mdef;
  lexicon_t *lex;
  int32 *cb2mllr;
  uint32 *ts2cb;
  segdmp_type_t in_stack_ffffffffffffff58;
  uint local_84;
  undefined8 local_80;
  model_def_t *local_78;
  uint32 **local_70;
  model_def_t *local_68;
  feat_t *local_60;
  model_def_t *local_58;
  model_def_t *local_50;
  char *local_48;
  int32 *local_40;
  uint32 *local_38;
  
  parse_cmd_ln(argc,argv);
  iVar1 = initialize((lexicon_t **)&local_50,&local_58,&local_60,&local_38,&local_40,in_R9);
  if (iVar1 != 0) goto LAB_00105e41;
  pcVar4 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar4,"-segtype");
  iVar1 = strcmp(pcVar5,"all");
  if (iVar1 == 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
            ,0x1ab,"Writing frames to one file\n");
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-segdmpfn");
    pcVar4 = cmd_ln_get();
    sVar3 = 0x1217cb;
    lVar6 = cmd_ln_int_r(pcVar4,"-stride");
    iVar1 = agg_all_seg(local_60,sVar3,pcVar5,(uint32)lVar6);
    if (iVar1 == 0) {
      return 0;
    }
    goto LAB_00105e41;
  }
  iVar1 = strcmp(pcVar5,"st");
  if (iVar1 == 0) {
    pcVar4 = cmd_ln_get();
    lVar6 = cmd_ln_int_r(pcVar4,"-cachesz");
    segdmp_set_bufsz((uint32)lVar6);
    pcVar4 = cmd_ln_get();
    local_68 = (model_def_t *)cmd_ln_str_list_r(pcVar4,"-segdmpdirs");
    pcVar4 = cmd_ln_get();
    local_48 = cmd_ln_str_r(pcVar4,"-segdmpfn");
    pcVar4 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar4,"-segidxfn");
    uVar2 = local_58->n_tied_state;
    local_78 = local_50;
    pcVar4 = cmd_ln_get();
    pcVar9 = cmd_ln_str_r(pcVar4,"-cntfn");
    pFVar7 = fopen(pcVar9,"r");
    pcVar4 = cmd_ln_get();
    pcVar9 = cmd_ln_str_r(pcVar4,"-cntfn");
    if (pFVar7 == (FILE *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x12f,"Count file %s not found; creating.\n",pcVar9);
      puVar8 = cnt_st_seg(local_58,(lexicon_t *)local_78);
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x132,"Writing %s.\n",pcVar5);
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      pFVar7 = fopen(pcVar5,"w");
      local_80 = (uint32 *)((ulong)local_80._4_4_ << 0x20);
      if (local_58->n_tied_state != 0) {
        uVar12 = 0;
        do {
          fprintf(pFVar7,"%u\n",(ulong)puVar8[uVar12]);
          uVar12 = (int)local_80 + 1;
          local_80 = (uint32 *)CONCAT44(local_80._4_4_,uVar12);
        } while (uVar12 < local_58->n_tied_state);
      }
LAB_001060fa:
      fclose(pFVar7);
      exit(0);
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
            ,0x13d,"Reading %s\n",pcVar9);
    puVar8 = (uint32 *)
             __ckd_calloc__((ulong)local_58->n_tied_state,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                            ,0x13e);
    local_80 = (uint32 *)((ulong)local_80._4_4_ << 0x20);
    if (local_58->n_tied_state != 0) {
      uVar12 = 0;
      do {
        iVar1 = __isoc99_fscanf(pFVar7,"%u",puVar8 + uVar12);
        if (iVar1 != 1) {
          pcVar4 = cmd_ln_get();
          pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
          lVar6 = 0x142;
          goto LAB_00105e32;
        }
        uVar12 = (int)local_80 + 1;
        local_80 = (uint32 *)CONCAT44(local_80._4_4_,uVar12);
      } while (uVar12 < local_58->n_tied_state);
    }
    iVar1 = __isoc99_fscanf(pFVar7,"%u",&local_80);
    if (iVar1 == -1) {
      fclose(pFVar7);
      i_n_stream = local_60->n_sv;
      if (i_n_stream == 0) {
        i_n_stream = local_60->n_stream;
      }
      if (local_60->lda == (mfcc_t ***)0x0) {
        puVar11 = local_60->sv_len;
        if (puVar11 == (uint32 *)0x0) {
          puVar11 = local_60->stream_len;
        }
      }
      else {
        puVar11 = &local_60->out_dim;
      }
      sVar3 = SEGDMP_TYPE_VQ;
      iVar1 = segdmp_open_write((char **)local_68,local_48,pcVar5,uVar2,puVar8,(uint32 **)0x0,
                                in_stack_ffffffffffffff58,i_n_stream,puVar11,local_60->out_dim);
      if (iVar1 == 0) {
        iVar1 = agg_st_seg(local_58,(lexicon_t *)local_78,local_60,local_38,local_40,sVar3);
LAB_00105df1:
        if (iVar1 == 0) {
          segdmp_close();
          return 0;
        }
        goto LAB_00105e41;
      }
      pcVar5 = "Unable to initialize segment dump\n";
      lVar6 = 0x1c1;
    }
    else {
      pcVar5 = "Expected EOF on count file, but remaining data found\n";
      lVar6 = 0x146;
    }
  }
  else {
    iVar1 = strcmp(pcVar5,"phn");
    if (iVar1 == 0) {
      pcVar4 = cmd_ln_get();
      lVar6 = cmd_ln_int_r(pcVar4,"-cachesz");
      segdmp_set_bufsz((uint32)lVar6);
      local_68 = local_50;
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      pFVar7 = fopen(pcVar5,"r");
      pcVar4 = cmd_ln_get();
      pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
      if (pFVar7 == (FILE *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x15d,"Count file %s not found; creating.\n",pcVar5);
        cnt_phn_seg(local_58,(lexicon_t *)local_68,(uint32 **)&local_80,&local_70);
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                ,0x160,"Writing %s.\n",pcVar5);
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
        pFVar7 = fopen(pcVar5,"w");
        local_84 = 0;
        uVar2 = acmod_set_n_acmod(local_58->acmod_set);
        if (uVar2 != 0) {
          do {
            fprintf(pFVar7,"%u",(ulong)local_80[local_84]);
            uVar10 = (ulong)local_84;
            if (local_80[uVar10] != 0) {
              uVar13 = 0;
              do {
                fprintf(pFVar7," %u",(ulong)local_70[uVar10][uVar13]);
                uVar13 = uVar13 + 1;
                uVar10 = (ulong)local_84;
              } while (uVar13 < local_80[uVar10]);
            }
            fputc(10,pFVar7);
            uVar12 = local_84 + 1;
            local_84 = uVar12;
            uVar2 = acmod_set_n_acmod(local_58->acmod_set);
          } while (uVar12 < uVar2);
        }
        goto LAB_001060fa;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
              ,0x16f,"Reading %s\n",pcVar5);
      local_78 = local_58;
      uVar2 = acmod_set_n_acmod(local_58->acmod_set);
      local_80 = (uint32 *)
                 __ckd_calloc__((ulong)uVar2,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                                ,0x173);
      local_70 = (uint32 **)
                 __ckd_calloc__((ulong)uVar2,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                                ,0x174);
      local_84 = 0;
      if (uVar2 != 0) {
        do {
          iVar1 = __isoc99_fscanf(pFVar7,"%u",local_80 + local_84);
          if (iVar1 != 1) {
            pcVar4 = cmd_ln_get();
            pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
            lVar6 = 0x179;
LAB_00105e32:
            err_msg_system(ERR_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                           ,lVar6,"Error reading count file %s",pcVar5);
            goto LAB_00105e41;
          }
          if ((ulong)local_80[local_84] != 0) {
            puVar8 = (uint32 *)
                     __ckd_calloc__((ulong)local_80[local_84],4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                                    ,0x17d);
            uVar10 = (ulong)local_84;
            local_70[uVar10] = puVar8;
            if (local_80[uVar10] != 0) {
              lVar6 = 0;
              uVar13 = 0;
              do {
                iVar1 = __isoc99_fscanf(pFVar7,"%u",(long)local_70[uVar10] + lVar6);
                if (iVar1 != 1) {
                  pcVar4 = cmd_ln_get();
                  pcVar5 = cmd_ln_str_r(pcVar4,"-cntfn");
                  lVar6 = 0x182;
                  goto LAB_00105e32;
                }
                uVar13 = uVar13 + 1;
                uVar10 = (ulong)local_84;
                lVar6 = lVar6 + 4;
              } while (uVar13 < local_80[uVar10]);
            }
          }
          local_84 = local_84 + 1;
        } while (local_84 < uVar2);
      }
      iVar1 = __isoc99_fscanf(pFVar7,"%u",&local_84);
      if (iVar1 == -1) {
        fclose(pFVar7);
        in_n_frame = local_70;
        puVar8 = local_80;
        pcVar4 = cmd_ln_get();
        dirs = cmd_ln_str_list_r(pcVar4,"-segdmpdirs");
        pcVar4 = cmd_ln_get();
        pcVar5 = cmd_ln_str_r(pcVar4,"-segdmpfn");
        pcVar4 = cmd_ln_get();
        pcVar9 = cmd_ln_str_r(pcVar4,"-segidxfn");
        sVar3 = acmod_set_n_acmod(local_78->acmod_set);
        uVar2 = local_60->n_sv;
        if (uVar2 == 0) {
          uVar2 = local_60->n_stream;
        }
        if (local_60->lda == (mfcc_t ***)0x0) {
          puVar11 = local_60->sv_len;
          if (puVar11 == (uint32 *)0x0) {
            puVar11 = local_60->stream_len;
          }
        }
        else {
          puVar11 = &local_60->out_dim;
        }
        iVar1 = segdmp_open_write(dirs,pcVar5,pcVar9,sVar3,puVar8,in_n_frame,
                                  in_stack_ffffffffffffff58,uVar2,puVar11,local_60->out_dim);
        if (iVar1 == 0) {
          iVar1 = agg_phn_seg((lexicon_t *)local_68,local_78->acmod_set,local_60,sVar3);
          goto LAB_00105df1;
        }
        pcVar5 = "Unable to initialize segment dump\n";
        lVar6 = 0x1d9;
      }
      else {
        pcVar5 = "Expected EOF on count file, but remaining data found\n";
        lVar6 = 0x189;
      }
    }
    else {
      iVar1 = strcmp(pcVar5,"wrd");
      if (iVar1 == 0) {
        pcVar5 = "Unimplememented -segtype wrd\n";
        lVar6 = 0x1e3;
      }
      else {
        iVar1 = strcmp(pcVar5,"utt");
        if (iVar1 != 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
                  ,0x1e9,"Unhandled -segtype %s\n",pcVar5);
          goto LAB_00105e41;
        }
        pcVar5 = "Unimplememented -segtype utt\n";
        lVar6 = 0x1e6;
      }
    }
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/main.c"
          ,lVar6,pcVar5);
LAB_00105e41:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    lexicon_t *lex;
    model_def_t *mdef;
    feat_t *feat;
    const char *segtype;
    segdmp_type_t dmp_type;
    uint32 *n_seg;
    uint32 **n_frame;
    uint32 *ts2cb;
    int32 *cb2mllr;
    /*eov*/

    parse_cmd_ln(argc, argv);

    if (initialize(&lex, &mdef, &feat, &ts2cb, &cb2mllr, &dmp_type) != S3_SUCCESS) {
	exit(1);
    }

    segtype = cmd_ln_str("-segtype");

    if (strcmp(segtype, "all") == 0) {
	E_INFO("Writing frames to one file\n");

	if (agg_all_seg(feat,
			dmp_type,
			cmd_ln_str("-segdmpfn"),
			cmd_ln_int32("-stride")) != S3_SUCCESS) {
	    exit(1);
	}
    }
    else if (strcmp(segtype, "st") == 0) {
	segdmp_set_bufsz(cmd_ln_int32("-cachesz"));
	
	if (segdmp_open_write(cmd_ln_str_list("-segdmpdirs"),
			      cmd_ln_str("-segdmpfn"),
			      cmd_ln_str("-segidxfn"),
			      mdef->n_tied_state,
			      cnt_st(mdef, lex),
			      NULL,
			      dmp_type,
			      feat_dimension1(feat),
			      feat_stream_lengths(feat),
			      feat_dimension(feat)) != S3_SUCCESS) {
	    E_FATAL("Unable to initialize segment dump\n");
	}
	
	if (agg_st_seg(mdef, lex, feat, ts2cb, cb2mllr, dmp_type) != S3_SUCCESS) {
	    exit(1);
	}
	
	segdmp_close();
    }
    else if (strcmp(segtype, "phn") == 0) {
	segdmp_set_bufsz(cmd_ln_int32("-cachesz"));
	
	cnt_phn(mdef, lex, &n_seg, &n_frame);

	if (segdmp_open_write(cmd_ln_str_list("-segdmpdirs"),
			      cmd_ln_str("-segdmpfn"),
			      cmd_ln_str("-segidxfn"),
			      acmod_set_n_acmod(mdef->acmod_set),
			      n_seg,
			      n_frame,
			      dmp_type,
			      feat_dimension1(feat),
			      feat_stream_lengths(feat),
			      feat_dimension(feat)) != S3_SUCCESS) {
	    E_FATAL("Unable to initialize segment dump\n");
	}
	
	if (agg_phn_seg(lex, mdef->acmod_set, feat, dmp_type) != S3_SUCCESS) {
	    exit(1);
	}
	
	segdmp_close();
    }
    else if (strcmp(segtype, "wrd") == 0) {
	E_FATAL("Unimplememented -segtype wrd\n");
    }
    else if (strcmp(segtype, "utt") == 0) {
	E_FATAL("Unimplememented -segtype utt\n");
    }
    else {
	E_FATAL("Unhandled -segtype %s\n", segtype);
    }

    return 0;
}